

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::addInversion(Molecule *this,Inversion *inversion)

{
  pointer *pppIVar1;
  iterator __position;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  _Var2;
  Inversion *local_10;
  
  local_10 = inversion;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Inversion**,std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Inversion*const>>
                    ((this->inversions_).
                     super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->inversions_).
                     super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->inversions_).
       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>::
      _M_realloc_insert<OpenMD::Inversion*const&>
                ((vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>> *)&this->inversions_
                 ,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppIVar1 = &(this->inversions_).
                  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addInversion(Inversion* inversion) {
    if (std::find(inversions_.begin(), inversions_.end(), inversion) ==
        inversions_.end()) {
      inversions_.push_back(inversion);
    }
  }